

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O2

wchar_t populate(chunk_conflict *c,_Bool valley)

{
  ushort uVar1;
  int iVar2;
  loc to_avoid;
  int16_t iVar3;
  uint32_t uVar4;
  wchar_t extraout_EAX;
  undefined7 in_register_00000031;
  uint uVar5;
  uint32_t m;
  bool bVar6;
  
  iVar2 = c->depth;
  uVar4 = iVar2 / 2;
  if ((int)CONCAT71(in_register_00000031,valley) == 0) {
    m = uVar4 + 10;
    bVar6 = SBORROW4(iVar2,0x29);
    iVar2 = iVar2 + -0x29;
  }
  else {
    bVar6 = SBORROW4(uVar4,0x1e);
    iVar2 = uVar4 - 0x1e;
    m = 0x1e;
  }
  if (bVar6 != iVar2 < 0) {
    m = uVar4;
  }
  uVar1 = z_info->level_monster_min;
  uVar4 = Rand_div(8);
  get_mon_num(c->depth,c->depth);
  for (uVar5 = (uint)uVar1 + uVar4 + m * 2 + 1; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
    if (uVar5 < 5) {
      get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
      get_mon_num(c->depth,c->depth);
    }
    to_avoid.x = (player->grid).x;
    to_avoid.y = (player->grid).y;
    pick_and_place_distant_monster((chunk *)c,to_avoid,L'\n',true,c->depth);
  }
  uVar4 = Rand_div(m);
  alloc_objects(c,L'\x03',L'\x01',uVar4 + L'\x01',c->depth,'\0');
  iVar3 = Rand_normal((uint)z_info->room_item_av,3);
  alloc_objects(c,L'\x03',L'\x03',(int)iVar3,c->depth,'\x01');
  iVar3 = Rand_normal((uint)z_info->both_item_av,3);
  alloc_objects(c,L'\x03',L'\x03',(int)iVar3,c->depth,'\x01');
  iVar3 = Rand_normal((uint)z_info->both_gold_av,3);
  alloc_objects(c,L'\x03',L'\x02',(int)iVar3,c->depth,'\x01');
  return extraout_EAX;
}

Assistant:

static int populate(struct chunk *c, bool valley)
{
	int i, j;

	/* Basic "amount" */
	int k = (c->depth / 2);

	if (valley) {
		if (k > 30)
			k = 30;
	} else {
		/* Gets hairy north of the mountains */
		if (c->depth > 40)
			k += 10;
	}

	/* Pick a base number of monsters */
	i = z_info->level_monster_min + randint1(8) + k;

	/* Build the monster probability table. */
	(void) get_mon_num(c->depth, c->depth);

	/* Put some monsters in the dungeon */
	for (j = i + k; j > 0; j--) {
		/* Always have some random monsters */
		if (j < 5) {
			/* Remove all monster restrictions. */
			get_mon_num_prep(NULL);

			/* Build the monster probability table. */
			(void) get_mon_num(c->depth, c->depth);
		}

		/*
		 * Place a random monster (quickly), but not in grids marked
		 * "SQUARE_TEMP".
		 */
		(void) pick_and_place_distant_monster(c, player->grid, 10, true,
											  c->depth);
	}

	/* Place some traps in the dungeon. */
	alloc_objects(c, SET_BOTH, TYP_TRAP, randint1(k), c->depth, 0);

	/* Put some objects in rooms */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(z_info->room_item_av, 3),
				  c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(z_info->both_item_av, 3),
				 c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD, Rand_normal(z_info->both_gold_av, 3),
				 c->depth, ORIGIN_FLOOR);

	return k;
}